

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

StructDef * __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GetNestedStruct
          (PythonStubGenerator *this,FieldDef *field)

{
  Parser *this_00;
  Value *pVVar1;
  StructDef *pSVar2;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"nested_flatbuffer",&local_41);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (pVVar1 == (Value *)0x0) {
    pSVar2 = (StructDef *)0x0;
  }
  else {
    pSVar2 = Parser::LookupStruct(this->parser_,&pVVar1->constant);
    if (pSVar2 == (StructDef *)0x0) {
      this_00 = this->parser_;
      Namer::NamespacedType
                (&local_40,&(this->namer_).super_Namer,&this_00->current_namespace_->components,
                 &pVVar1->constant);
      pSVar2 = Parser::LookupStruct(this_00,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return pSVar2;
}

Assistant:

const StructDef *GetNestedStruct(const FieldDef *field) const {
    const Value *nested = field->attributes.Lookup("nested_flatbuffer");
    if (nested == nullptr) return nullptr;

    StructDef *nested_def = parser_.LookupStruct(nested->constant);
    if (nested_def != nullptr) return nested_def;

    return parser_.LookupStruct(namer_.NamespacedType(
        parser_.current_namespace_->components, nested->constant));
  }